

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

double __thiscall
imrt::ApertureILS::improvementAperture
          (ApertureILS *this,int beamlet,Station *station,bool open_beamlet,double c_eval,Plan *P,
          bool best_improvement)

{
  int aperture;
  Plan *pPVar1;
  undefined8 uVar2;
  int iVar3;
  _Base_ptr *pp_Var4;
  undefined7 in_register_00000009;
  ulong uVar5;
  ulong uVar6;
  Plan *pPVar7;
  undefined7 in_register_00000089;
  uint uVar8;
  _Base_ptr p_Var9;
  byte bVar10;
  size_t extraout_XMM0_Qb;
  size_t extraout_XMM0_Qb_00;
  size_t sVar11;
  _Base_ptr local_b0;
  undefined1 local_88 [16];
  _Base_ptr local_78;
  undefined1 local_70 [16];
  _Base_ptr local_60;
  undefined4 local_54;
  _Base_ptr local_50;
  _Base_ptr local_48;
  size_t sStack_40;
  
  local_54 = (undefined4)CONCAT71(in_register_00000089,best_improvement);
  uVar6 = (ulong)(uint)beamlet;
  local_78 = (_Base_ptr)0x0;
  local_88._0_8_ = (Plan *)local_88;
  local_88._8_8_ = (Plan *)local_88;
  if ((int)CONCAT71(in_register_00000009,open_beamlet) == 0) {
    pPVar7 = (Plan *)local_70;
    Station::getOpen((vector<int,_std::allocator<int>_> *)pPVar7,station,beamlet);
  }
  else {
    pPVar7 = (Plan *)local_70;
    Station::getClosed((vector<int,_std::allocator<int>_> *)pPVar7,station,beamlet);
  }
  uVar2 = local_70._0_8_;
  if (local_70._8_8_ - local_70._0_8_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[NOPT] ",7);
    local_b0 = (_Base_ptr)c_eval;
    pPVar7 = (Plan *)local_88._0_8_;
    if ((Plan *)local_70._0_8_ == (Plan *)0x0) goto joined_r0x00129743;
  }
  else {
    p_Var9 = (_Base_ptr)((long)(local_70._8_8_ - local_70._0_8_) >> 2);
    iVar3 = rand();
    uVar5 = (ulong)(long)iVar3 % (ulong)p_Var9;
    local_48 = (_Base_ptr)0xbff0000000000000;
    sStack_40 = 0;
    iVar3 = 0;
    local_50 = p_Var9;
    do {
      aperture = *(int *)((long)&((ILS *)uVar2)->_vptr_ILS + (long)(int)uVar5 * 4);
      if (open_beamlet) {
        local_b0 = (_Base_ptr)openBeamlet((ApertureILS *)pPVar7,beamlet,aperture,station,c_eval,P);
        sVar11 = extraout_XMM0_Qb;
      }
      else {
        local_b0 = (_Base_ptr)
                   closeBeamlet((ApertureILS *)pPVar7,beamlet,0,aperture,station,c_eval,P);
        sVar11 = extraout_XMM0_Qb_00;
      }
      bVar10 = -(0.0 <= (double)local_48) & -((double)local_48 - (double)local_b0 <= 1e-05);
      if ((bVar10 & 1) == 0) {
        uVar6 = uVar5 & 0xffffffff;
        local_48 = local_b0;
        sStack_40 = sVar11;
      }
      if (((bVar10 | (byte)local_54) & 1) == 0) goto LAB_00129721;
      Station::undoLast_abi_cxx11_
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_70,
                 station);
      pPVar7 = (Plan *)local_88._0_8_;
      while (pPVar7 != (Plan *)local_88) {
        pPVar1 = (Plan *)(((_List_impl *)&((ILS *)&pPVar7->_vptr_Plan)->_vptr_ILS)->_M_node).
                         super__List_node_base._M_next;
        operator_delete(pPVar7);
        pPVar7 = pPVar1;
      }
      local_78 = (_Base_ptr)0x0;
      if ((Plan *)local_70._0_8_ == (Plan *)local_70) {
        pp_Var4 = &local_78;
        local_88._0_8_ = (Plan *)local_88;
        local_88._8_8_ = (Plan *)local_88;
      }
      else {
        ((ILS *)&((Plan *)local_70._8_8_)->_vptr_Plan)->_vptr_ILS = (_func_int **)local_88;
        *(Plan **)&(((Plan *)local_70._0_8_)->angle2station)._M_t._M_impl = (Plan *)local_88;
        pp_Var4 = &local_60;
        local_88._0_8_ = local_70._0_8_;
        local_88._8_8_ = local_70._8_8_;
        local_78 = local_60;
      }
      *pp_Var4 = (_Base_ptr)0x0;
      if (local_78 != (_Base_ptr)0x0) {
        pPVar7 = P;
        Plan::incremental_eval
                  (P,station,
                   (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   local_88);
      }
      iVar3 = iVar3 + 1;
      if ((bVar10 & 1) == 0) {
        iVar3 = 1;
      }
      uVar8 = (int)uVar5 + 1;
      if (local_50 == (_Base_ptr)(long)(int)uVar8) {
        uVar8 = 0;
      }
      uVar5 = (ulong)uVar8;
    } while ((_Base_ptr)(long)iVar3 < local_50);
    iVar3 = *(int *)((long)&((ILS *)uVar2)->_vptr_ILS + (long)(int)uVar6 * 4);
    if (open_beamlet) {
      local_b0 = (_Base_ptr)openBeamlet((ApertureILS *)pPVar7,beamlet,iVar3,station,c_eval,P);
    }
    else {
      local_b0 = (_Base_ptr)closeBeamlet((ApertureILS *)pPVar7,beamlet,0,iVar3,station,c_eval,P);
    }
  }
LAB_00129721:
  operator_delete((void *)uVar2);
  pPVar7 = (Plan *)local_88._0_8_;
joined_r0x00129743:
  while (pPVar7 != (Plan *)local_88) {
    pPVar1 = (Plan *)((ILS *)&pPVar7->_vptr_Plan)->_vptr_ILS;
    operator_delete(pPVar7);
    pPVar7 = pPVar1;
  }
  return (double)local_b0;
}

Assistant:

double ApertureILS::improvementAperture(int beamlet, Station& station, bool open_beamlet, 
                                             double c_eval, Plan& P, bool best_improvement) {
  double local_best=-1, aux_eval=0;
  list<pair<int, double> > diff;
  int a, local_a, i;
  bool flag=true; 
  vector<int> a_list;
  
  if (!open_beamlet) a_list = station.getOpen(beamlet);
  else a_list = station.getClosed(beamlet);
  
  if (a_list.size()<1) {
    cout << "[NOPT] ";
    //cout << endl << "Warning: not possible to make aperture change beamlet:" << beamlet <<endl;
    return(c_eval);
  }
  
  a = (int)rand() % a_list.size();
  i = 0;
  
  // Check every aperture 
  while(flag) {
    if (!open_beamlet) {
      aux_eval = closeBeamlet(beamlet, 0, a_list[a], station, c_eval, P); 
    } else {
      aux_eval = openBeamlet(beamlet, a_list[a], station, c_eval, P);
    } 
    
    // First improvement
    if (local_best < 0 || (local_best-aux_eval) >0.00001){
      local_best = aux_eval;
      local_a =a ;
      i=0; // to support best improvement
      if (!best_improvement)
        return(local_best);
    } 
    
    diff = station.undoLast();
    if (diff.size()>0)
      aux_eval = P.incremental_eval(station, diff);
    i++;
    a++;
    if (a==a_list.size()) a=0;
    if (i>=a_list.size()) flag=false;
  }
  
  // If no improvement was found, return the best solution found.
  if (!open_beamlet) {
    local_best = closeBeamlet(beamlet, 0, a_list[local_a], station, c_eval, P);
  } else{
    local_best = openBeamlet(beamlet, a_list[local_a], station, c_eval, P);
  }
  return(local_best);
  
}